

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O2

void dlep_radio_apply_interface_settings(dlep_radio_if *interface)

{
  list_entity *plVar1;
  avl_tree *paVar2;
  avl_tree *paVar3;
  oonf_stream_managed_config *poVar4;
  
  oonf_packet_apply_managed(&(interface->interf).udp,&(interface->interf).udp_config);
  poVar4 = &interface->tcp_config;
  oonf_stream_apply_managed(&interface->tcp);
  paVar2 = dlep_extension_get_tree();
  while( true ) {
    paVar2 = (avl_tree *)(paVar2->list_head).next;
    plVar1 = (paVar2->list_head).prev;
    paVar3 = dlep_extension_get_tree();
    if (plVar1 == (paVar3->list_head).prev) break;
    if (paVar2[-2].comp != (_func_int_void_ptr_void_ptr *)0x0) {
      (*paVar2[-2].comp)(interface,poVar4);
    }
  }
  return;
}

Assistant:

void
dlep_radio_apply_interface_settings(struct dlep_radio_if *interface) {
  struct dlep_extension *ext;

  oonf_packet_apply_managed(&interface->interf.udp, &interface->interf.udp_config);
  oonf_stream_apply_managed(&interface->tcp, &interface->tcp_config);

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_apply_radio) {
      ext->cb_session_apply_radio(&interface->interf.session);
    }
  }
}